

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

void __thiscall
cmStateDirectory::AppendProperty
          (cmStateDirectory *this,string *prop,string *value,bool asString,cmListFileBacktrace *lfbt
          )

{
  bool bVar1;
  PointerType pBVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> BStack_148;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_118;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_108;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_f8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_e8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_48,(string *)value);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_d8,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)lfbt);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&BStack_148,&local_48,(cmListFileBacktrace *)&local_d8);
    AppendIncludeDirectoriesEntry(this,&BStack_148);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&BStack_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    this_00 = &local_48;
  }
  else {
    bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_68,(string *)value);
      std::
      __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_e8,
                     (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      *)lfbt);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&BStack_148,&local_68,(cmListFileBacktrace *)&local_e8);
      AppendCompileOptionsEntry(this,&BStack_148);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&BStack_148);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      this_00 = &local_68;
    }
    else {
      bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_88,(string *)value);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_f8,
                       (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)lfbt);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  (&BStack_148,&local_88,(cmListFileBacktrace *)&local_f8);
        AppendCompileDefinitionsEntry(this,&BStack_148);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&BStack_148);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
        this_00 = &local_88;
      }
      else {
        bVar1 = std::operator==(prop,"LINK_OPTIONS");
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_a8,(string *)value);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_108,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)lfbt);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&BStack_148,&local_a8,(cmListFileBacktrace *)&local_108);
          AppendLinkOptionsEntry(this,&BStack_148);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&BStack_148);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
          this_00 = &local_a8;
        }
        else {
          bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
          if (!bVar1) {
            pBVar2 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmPropertyMap::AppendProperty(&pBVar2->Properties,prop,value,asString);
            return;
          }
          std::__cxx11::string::string((string *)&local_c8,(string *)value);
          std::
          __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ::__shared_ptr(&local_118,
                         (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          *)lfbt);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                    (&BStack_148,&local_c8,(cmListFileBacktrace *)&local_118);
          AppendLinkDirectoriesEntry(this,&BStack_148);
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                    (&BStack_148);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
          this_00 = &local_c8;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void cmStateDirectory::AppendProperty(const std::string& prop,
                                      const std::string& value, bool asString,
                                      cmListFileBacktrace const& lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES") {
    this->AppendIncludeDirectoriesEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_OPTIONS") {
    this->AppendCompileOptionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "COMPILE_DEFINITIONS") {
    this->AppendCompileDefinitionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_OPTIONS") {
    this->AppendLinkOptionsEntry(BT<std::string>(value, lfbt));
    return;
  }
  if (prop == "LINK_DIRECTORIES") {
    this->AppendLinkDirectoriesEntry(BT<std::string>(value, lfbt));
    return;
  }

  this->DirectoryState->Properties.AppendProperty(prop, value, asString);
}